

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O1

QString * __thiscall QStorageInfo::displayName(QString *__return_storage_ptr__,QStorageInfo *this)

{
  QStorageInfoPrivate *pQVar1;
  long lVar2;
  Data *pDVar3;
  
  pQVar1 = (this->d).d.ptr;
  lVar2 = (pQVar1->name).d.size;
  if (lVar2 == 0) {
    pDVar3 = (pQVar1->rootPath).d.d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (pQVar1->rootPath).d.ptr;
    (__return_storage_ptr__->d).size = (pQVar1->rootPath).d.size;
  }
  else {
    pDVar3 = (pQVar1->name).d.d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (pQVar1->name).d.ptr;
    (__return_storage_ptr__->d).size = lVar2;
  }
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QStorageInfo::displayName() const
{
    if (!d->name.isEmpty())
        return d->name;
    return d->rootPath;
}